

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_passes.cpp
# Opt level: O0

Pass * wasm::createCatchPopFixupPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x130);
  memset(this,0,0x130);
  anon_unknown_19::CatchPopFixup::CatchPopFixup((CatchPopFixup *)this);
  return this;
}

Assistant:

Pass* createCatchPopFixupPass() { return new CatchPopFixup(); }